

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xc_kernel_test.cxx
# Opt level: O0

void compare_libxc_builtin(TestInterface interface,EvalType evaltype,Kernel kern,Spin polar)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  bool bVar1;
  size_t sVar2;
  ScopedMessage *pSVar3;
  int in_ESI;
  int in_EDI;
  AssertionHandler catchAssertionHandler_5;
  ScopedMessage scopedMessage64;
  unsigned_long i_2;
  AssertionHandler catchAssertionHandler_4;
  ScopedMessage scopedMessage63;
  unsigned_long i_1;
  AssertionHandler catchAssertionHandler_3;
  ScopedMessage scopedMessage62;
  unsigned_long i;
  vector<double,_std::allocator<double>_> vtau_builtin;
  vector<double,_std::allocator<double>_> vlapl_builtin;
  vector<double,_std::allocator<double>_> vsigma_builtin;
  vector<double,_std::allocator<double>_> vrho_builtin;
  vector<double,_std::allocator<double>_> exc_builtin;
  vector<double,_std::allocator<double>_> vtau_libxc;
  vector<double,_std::allocator<double>_> vlapl_libxc;
  vector<double,_std::allocator<double>_> vsigma_libxc;
  vector<double,_std::allocator<double>_> vrho_libxc;
  vector<double,_std::allocator<double>_> exc_libxc;
  vector<double,_std::allocator<double>_> tau_use;
  vector<double,_std::allocator<double>_> lapl_use;
  vector<double,_std::allocator<double>_> sigma_use;
  vector<double,_std::allocator<double>_> rho_use;
  vector<double,_std::allocator<double>_> tau_zero;
  vector<double,_std::allocator<double>_> lapl_zero;
  vector<double,_std::allocator<double>_> sigma_zero;
  vector<double,_std::allocator<double>_> rho_zero;
  vector<double,_std::allocator<double>_> tau_small;
  vector<double,_std::allocator<double>_> lapl_small;
  vector<double,_std::allocator<double>_> sigma_small;
  vector<double,_std::allocator<double>_> rho_small;
  int len_tau;
  int len_lapl;
  int len_sigma;
  int len_rho;
  XCKernel func_builtin;
  XCKernel func_libxc;
  int npts;
  AssertionHandler catchAssertionHandler_2;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  vector<double,_std::allocator<double>_> ref_tau;
  vector<double,_std::allocator<double>_> ref_lapl;
  vector<double,_std::allocator<double>_> ref_sigma;
  vector<double,_std::allocator<double>_> ref_rho;
  size_t npts_lapl;
  size_t npts_mgga;
  size_t npts_gga;
  size_t npts_lda;
  size_t in_stack_fffffffffffff088;
  ITransientExpression *pIVar4;
  MessageBuilder *in_stack_fffffffffffff090;
  Kernel in_stack_fffffffffffff098;
  Backend in_stack_fffffffffffff09c;
  char *pcVar5;
  ScopedMessage *in_stack_fffffffffffff0a0;
  double **in_stack_fffffffffffff0a8;
  undefined4 in_stack_fffffffffffff0b0;
  OfType in_stack_fffffffffffff0b4;
  ExprLhs<double> in_stack_fffffffffffff0b8;
  MessageBuilder *in_stack_fffffffffffff0c0;
  MessageBuilder *in_stack_fffffffffffff0c8;
  MessageBuilder *in_stack_fffffffffffff0d0;
  MessageBuilder *in_stack_fffffffffffff0d8;
  MessageBuilder *builder;
  ScopedMessage *in_stack_fffffffffffff0e0;
  ScopedMessage *this;
  undefined8 in_stack_fffffffffffff0e8;
  Spin s;
  double **in_stack_fffffffffffff0f0;
  double **in_stack_fffffffffffff0f8;
  double **in_stack_fffffffffffff100;
  double **in_stack_fffffffffffff108;
  double **in_stack_fffffffffffff110;
  ulong uVar6;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff128;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff130;
  MessageBuilder local_cc0;
  MessageBuilder local_c58 [2];
  ScopedMessage *local_b90;
  double local_b60;
  StringRef local_b28;
  SourceLineInfo local_b18;
  StringRef local_b08;
  SourceLineInfo local_ab0;
  StringRef local_aa0;
  ulong local_9e8;
  double local_9b8;
  StringRef local_980;
  SourceLineInfo local_970;
  StringRef local_960;
  SourceLineInfo local_908;
  StringRef local_8f8;
  ulong local_840;
  double *local_838;
  undefined1 local_830 [16];
  undefined1 local_820 [40];
  double *local_7f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_7f0;
  double *local_7e0;
  double *local_7d8;
  double *local_7d0;
  double *local_7c8;
  double *local_7c0;
  double *local_7b8;
  double *local_7b0;
  undefined1 local_7a8 [16];
  double *local_798;
  double *local_790;
  double *local_788;
  double *local_780;
  double *local_778;
  double *local_770;
  double *local_768;
  double *local_760;
  undefined1 local_758 [16];
  double *local_748;
  double *local_740;
  double *local_738;
  double *local_730;
  double *local_728;
  double *local_720;
  double *local_718;
  double *local_710;
  double *local_708;
  double *local_700;
  double *local_6f8;
  double *local_6f0;
  double *local_6e8;
  double *local_6e0;
  double *local_6d8;
  double *local_6d0;
  double *local_6c8;
  double *local_6c0;
  double *local_6b8;
  double *local_6b0;
  double *local_6a8;
  double *local_6a0;
  double *local_698;
  double *local_690;
  vector<double,_std::allocator<double>_> local_640;
  vector<double,_std::allocator<double>_> local_620;
  vector<double,_std::allocator<double>_> local_600 [4];
  vector<double,_std::allocator<double>_> local_5a0;
  vector<double,_std::allocator<double>_> local_580;
  vector<double,_std::allocator<double>_> local_560 [5];
  undefined8 local_4e0;
  undefined8 local_4b8;
  undefined8 local_490;
  undefined8 local_468;
  undefined8 local_440;
  undefined8 local_418;
  undefined8 local_3f0;
  undefined8 local_3c8;
  undefined4 local_3a8;
  undefined4 local_3a4;
  undefined4 local_3a0;
  undefined4 local_39c;
  undefined4 local_388;
  unsigned_long local_380;
  StringRef local_348;
  SourceLineInfo local_338;
  StringRef local_328;
  unsigned_long local_2c8;
  StringRef local_290;
  SourceLineInfo local_280;
  StringRef local_270;
  unsigned_long local_210;
  StringRef local_1d8;
  SourceLineInfo local_1c8;
  StringRef local_1b8;
  undefined4 local_18;
  int local_8;
  int local_4;
  
  s = (Spin)((ulong)in_stack_fffffffffffff0e8 >> 0x20);
  local_8 = in_ESI;
  local_4 = in_EDI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x17ba90);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x17ba9d);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x17baaa);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x17bab7);
  load_reference_density(s);
  std::tie<unsigned_long,std::vector<double,std::allocator<double>>>
            ((unsigned_long *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098),
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090);
  std::tuple<unsigned_long&,std::vector<double,std::allocator<double>>&>::operator=
            ((tuple<unsigned_long_&,_std::vector<double,_std::allocator<double>_>_&> *)
             in_stack_fffffffffffff0a0,
             (pair<int,_std::vector<double,_std::allocator<double>_>_> *)
             CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  std::pair<int,_std::vector<double,_std::allocator<double>_>_>::~pair
            ((pair<int,_std::vector<double,_std::allocator<double>_>_> *)0x17bb1c);
  load_reference_sigma(s);
  std::tie<unsigned_long,std::vector<double,std::allocator<double>>>
            ((unsigned_long *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098),
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090);
  std::tuple<unsigned_long&,std::vector<double,std::allocator<double>>&>::operator=
            ((tuple<unsigned_long_&,_std::vector<double,_std::allocator<double>_>_&> *)
             in_stack_fffffffffffff0a0,
             (pair<int,_std::vector<double,_std::allocator<double>_>_> *)
             CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  std::pair<int,_std::vector<double,_std::allocator<double>_>_>::~pair
            ((pair<int,_std::vector<double,_std::allocator<double>_>_> *)0x17bb81);
  load_reference_lapl(s);
  std::tie<unsigned_long,std::vector<double,std::allocator<double>>>
            ((unsigned_long *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098),
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090);
  std::tuple<unsigned_long&,std::vector<double,std::allocator<double>>&>::operator=
            ((tuple<unsigned_long_&,_std::vector<double,_std::allocator<double>_>_&> *)
             in_stack_fffffffffffff0a0,
             (pair<int,_std::vector<double,_std::allocator<double>_>_> *)
             CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  std::pair<int,_std::vector<double,_std::allocator<double>_>_>::~pair
            ((pair<int,_std::vector<double,_std::allocator<double>_>_> *)0x17bbe6);
  load_reference_tau(s);
  std::tie<unsigned_long,std::vector<double,std::allocator<double>>>
            ((unsigned_long *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098),
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090);
  std::tuple<unsigned_long&,std::vector<double,std::allocator<double>>&>::operator=
            ((tuple<unsigned_long_&,_std::vector<double,_std::allocator<double>_>_&> *)
             in_stack_fffffffffffff0a0,
             (pair<int,_std::vector<double,_std::allocator<double>_>_> *)
             CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  std::pair<int,_std::vector<double,_std::allocator<double>_>_>::~pair
            ((pair<int,_std::vector<double,_std::allocator<double>_>_> *)0x17bc3b);
  local_1b8 = operator____catch_sr((char *)in_stack_fffffffffffff090,in_stack_fffffffffffff088);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_1c8,
             "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]ExchCXX/test/xc_kernel_test.cxx"
             ,0x2ff);
  local_1d8 = operator____catch_sr((char *)in_stack_fffffffffffff090,in_stack_fffffffffffff088);
  pIVar4 = (ITransientExpression *)CONCAT44((int)(in_stack_fffffffffffff088 >> 0x20),1);
  macroName.m_size._0_4_ = in_stack_fffffffffffff0b0;
  macroName.m_start = (char *)in_stack_fffffffffffff0a8;
  macroName.m_size._4_4_ = in_stack_fffffffffffff0b4;
  capturedExpression.m_start._4_4_ = in_stack_fffffffffffff09c;
  capturedExpression.m_start._0_4_ = in_stack_fffffffffffff098;
  capturedExpression.m_size = (size_type)in_stack_fffffffffffff0a0;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)in_stack_fffffffffffff090,macroName,(SourceLineInfo *)pIVar4,
             capturedExpression,(Flags)in_stack_fffffffffffff0c0);
  local_210 = (unsigned_long)Catch::operator<=<unsigned_long,_0>((Decomposer *)pIVar4,0x17bcf3);
  Catch::operator==((ExprLhs<unsigned_long> *)in_stack_fffffffffffff0b8.m_lhs,
                    CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0));
  Catch::AssertionHandler::handleExpr((AssertionHandler *)in_stack_fffffffffffff090,pIVar4);
  Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff090);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffff090);
  local_270 = operator____catch_sr((char *)in_stack_fffffffffffff090,(size_t)pIVar4);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_280,
             "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]ExchCXX/test/xc_kernel_test.cxx"
             ,0x300);
  local_290 = operator____catch_sr((char *)in_stack_fffffffffffff090,(size_t)pIVar4);
  pIVar4 = (ITransientExpression *)CONCAT44((int)((ulong)pIVar4 >> 0x20),1);
  macroName_00.m_size._0_4_ = in_stack_fffffffffffff0b0;
  macroName_00.m_start = (char *)in_stack_fffffffffffff0a8;
  macroName_00.m_size._4_4_ = in_stack_fffffffffffff0b4;
  capturedExpression_00.m_start._4_4_ = in_stack_fffffffffffff09c;
  capturedExpression_00.m_start._0_4_ = in_stack_fffffffffffff098;
  capturedExpression_00.m_size = (size_type)in_stack_fffffffffffff0a0;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)in_stack_fffffffffffff090,macroName_00,(SourceLineInfo *)pIVar4,
             capturedExpression_00,(Flags)in_stack_fffffffffffff0c0);
  local_2c8 = (unsigned_long)Catch::operator<=<unsigned_long,_0>((Decomposer *)pIVar4,0x17be6f);
  Catch::operator==((ExprLhs<unsigned_long> *)in_stack_fffffffffffff0b8.m_lhs,
                    CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0));
  Catch::AssertionHandler::handleExpr((AssertionHandler *)in_stack_fffffffffffff090,pIVar4);
  Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff090);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffff090);
  local_328 = operator____catch_sr((char *)in_stack_fffffffffffff090,(size_t)pIVar4);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_338,
             "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]ExchCXX/test/xc_kernel_test.cxx"
             ,0x301);
  local_348 = operator____catch_sr((char *)in_stack_fffffffffffff090,(size_t)pIVar4);
  pIVar4 = (ITransientExpression *)CONCAT44((int)((ulong)pIVar4 >> 0x20),1);
  macroName_01.m_size._0_4_ = in_stack_fffffffffffff0b0;
  macroName_01.m_start = (char *)in_stack_fffffffffffff0a8;
  macroName_01.m_size._4_4_ = in_stack_fffffffffffff0b4;
  capturedExpression_01.m_start._4_4_ = in_stack_fffffffffffff09c;
  capturedExpression_01.m_start._0_4_ = in_stack_fffffffffffff098;
  capturedExpression_01.m_size = (size_type)in_stack_fffffffffffff0a0;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)in_stack_fffffffffffff090,macroName_01,(SourceLineInfo *)pIVar4,
             capturedExpression_01,(Flags)in_stack_fffffffffffff0c0);
  local_380 = (unsigned_long)Catch::operator<=<unsigned_long,_0>((Decomposer *)pIVar4,0x17c017);
  Catch::operator==((ExprLhs<unsigned_long> *)in_stack_fffffffffffff0b8.m_lhs,
                    CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0));
  Catch::AssertionHandler::handleExpr((AssertionHandler *)in_stack_fffffffffffff090,pIVar4);
  Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff090);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffff090);
  local_388 = local_18;
  ExchCXX::XCKernel::XCKernel
            ((XCKernel *)in_stack_fffffffffffff0a0,in_stack_fffffffffffff09c,
             in_stack_fffffffffffff098,(Spin)((ulong)in_stack_fffffffffffff090 >> 0x20));
  ExchCXX::XCKernel::XCKernel
            ((XCKernel *)in_stack_fffffffffffff0a0,in_stack_fffffffffffff09c,
             in_stack_fffffffffffff098,(Spin)((ulong)in_stack_fffffffffffff090 >> 0x20));
  sVar2 = ExchCXX::XCKernel::rho_buffer_len((XCKernel *)in_stack_fffffffffffff090,(size_t)pIVar4);
  local_39c = (undefined4)sVar2;
  sVar2 = ExchCXX::XCKernel::sigma_buffer_len((XCKernel *)in_stack_fffffffffffff090,(size_t)pIVar4);
  local_3a0 = (undefined4)sVar2;
  sVar2 = ExchCXX::XCKernel::lapl_buffer_len((XCKernel *)in_stack_fffffffffffff090,(size_t)pIVar4);
  local_3a4 = (undefined4)sVar2;
  sVar2 = ExchCXX::XCKernel::tau_buffer_len((XCKernel *)in_stack_fffffffffffff090,(size_t)pIVar4);
  local_3a8 = (undefined4)sVar2;
  local_3c8 = 0x3d3c25c268497682;
  std::allocator<double>::allocator((allocator<double> *)0x17c203);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0),
             (size_type)in_stack_fffffffffffff0a8,(value_type_conflict1 *)in_stack_fffffffffffff0a0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  std::allocator<double>::~allocator((allocator<double> *)0x17c237);
  local_3f0 = 0x3d06849b86a12b9b;
  std::allocator<double>::allocator((allocator<double> *)0x17c26e);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0),
             (size_type)in_stack_fffffffffffff0a8,(value_type_conflict1 *)in_stack_fffffffffffff0a0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  std::allocator<double>::~allocator((allocator<double> *)0x17c2a2);
  local_418 = 0x3d06849b86a12b9b;
  std::allocator<double>::allocator((allocator<double> *)0x17c2d9);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0),
             (size_type)in_stack_fffffffffffff0a8,(value_type_conflict1 *)in_stack_fffffffffffff0a0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  std::allocator<double>::~allocator((allocator<double> *)0x17c30d);
  local_440 = 0x3d06849b86a12b9b;
  std::allocator<double>::allocator((allocator<double> *)0x17c344);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0),
             (size_type)in_stack_fffffffffffff0a8,(value_type_conflict1 *)in_stack_fffffffffffff0a0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  std::allocator<double>::~allocator((allocator<double> *)0x17c378);
  local_468 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x17c3a9);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0),
             (size_type)in_stack_fffffffffffff0a8,(value_type_conflict1 *)in_stack_fffffffffffff0a0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  std::allocator<double>::~allocator((allocator<double> *)0x17c3dd);
  local_490 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x17c40e);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0),
             (size_type)in_stack_fffffffffffff0a8,(value_type_conflict1 *)in_stack_fffffffffffff0a0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  std::allocator<double>::~allocator((allocator<double> *)0x17c442);
  local_4b8 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x17c473);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0),
             (size_type)in_stack_fffffffffffff0a8,(value_type_conflict1 *)in_stack_fffffffffffff0a0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  std::allocator<double>::~allocator((allocator<double> *)0x17c4a7);
  local_4e0 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x17c4d8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0),
             (size_type)in_stack_fffffffffffff0a8,(value_type_conflict1 *)in_stack_fffffffffffff0a0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098));
  std::allocator<double>::~allocator((allocator<double> *)0x17c50c);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x17c519);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x17c526);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x17c533);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x17c540);
  if (local_8 == 0) {
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_fffffffffffff130,in_stack_fffffffffffff128);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_fffffffffffff130,in_stack_fffffffffffff128);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_fffffffffffff130,in_stack_fffffffffffff128);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_fffffffffffff130,in_stack_fffffffffffff128);
  }
  if (local_8 == 1) {
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_fffffffffffff130,in_stack_fffffffffffff128);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_fffffffffffff130,in_stack_fffffffffffff128);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_fffffffffffff130,in_stack_fffffffffffff128);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_fffffffffffff130,in_stack_fffffffffffff128);
  }
  if (local_8 == 2) {
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_fffffffffffff130,in_stack_fffffffffffff128);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_fffffffffffff130,in_stack_fffffffffffff128);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_fffffffffffff130,in_stack_fffffffffffff128);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_fffffffffffff130,in_stack_fffffffffffff128);
  }
  ExchCXX::XCKernel::exc_buffer_len((XCKernel *)in_stack_fffffffffffff090,(size_t)pIVar4);
  std::allocator<double>::allocator((allocator<double> *)0x17c858);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0),
             (size_type)in_stack_fffffffffffff0a8,(allocator_type *)in_stack_fffffffffffff0a0);
  std::allocator<double>::~allocator((allocator<double> *)0x17c884);
  ExchCXX::XCKernel::vrho_buffer_len((XCKernel *)in_stack_fffffffffffff090,(size_t)pIVar4);
  std::allocator<double>::allocator((allocator<double> *)0x17c8b6);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0),
             (size_type)in_stack_fffffffffffff0a8,(allocator_type *)in_stack_fffffffffffff0a0);
  std::allocator<double>::~allocator((allocator<double> *)0x17c8e2);
  ExchCXX::XCKernel::vsigma_buffer_len((XCKernel *)in_stack_fffffffffffff090,(size_t)pIVar4);
  std::allocator<double>::allocator((allocator<double> *)0x17c914);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0),
             (size_type)in_stack_fffffffffffff0a8,(allocator_type *)in_stack_fffffffffffff0a0);
  std::allocator<double>::~allocator((allocator<double> *)0x17c940);
  ExchCXX::XCKernel::vlapl_buffer_len((XCKernel *)in_stack_fffffffffffff090,(size_t)pIVar4);
  std::allocator<double>::allocator((allocator<double> *)0x17c972);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0),
             (size_type)in_stack_fffffffffffff0a8,(allocator_type *)in_stack_fffffffffffff0a0);
  std::allocator<double>::~allocator((allocator<double> *)0x17c99e);
  ExchCXX::XCKernel::vtau_buffer_len((XCKernel *)in_stack_fffffffffffff090,(size_t)pIVar4);
  std::allocator<double>::allocator((allocator<double> *)0x17c9d0);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0),
             (size_type)in_stack_fffffffffffff0a8,(allocator_type *)in_stack_fffffffffffff0a0);
  std::allocator<double>::~allocator((allocator<double> *)0x17c9fc);
  ExchCXX::XCKernel::exc_buffer_len((XCKernel *)in_stack_fffffffffffff090,(size_t)pIVar4);
  std::allocator<double>::allocator((allocator<double> *)0x17ca2e);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0),
             (size_type)in_stack_fffffffffffff0a8,(allocator_type *)in_stack_fffffffffffff0a0);
  std::allocator<double>::~allocator((allocator<double> *)0x17ca5a);
  ExchCXX::XCKernel::vrho_buffer_len((XCKernel *)in_stack_fffffffffffff090,(size_t)pIVar4);
  std::allocator<double>::allocator((allocator<double> *)0x17ca8c);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0),
             (size_type)in_stack_fffffffffffff0a8,(allocator_type *)in_stack_fffffffffffff0a0);
  std::allocator<double>::~allocator((allocator<double> *)0x17cab8);
  ExchCXX::XCKernel::vsigma_buffer_len((XCKernel *)in_stack_fffffffffffff090,(size_t)pIVar4);
  std::allocator<double>::allocator((allocator<double> *)0x17caea);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0),
             (size_type)in_stack_fffffffffffff0a8,(allocator_type *)in_stack_fffffffffffff0a0);
  std::allocator<double>::~allocator((allocator<double> *)0x17cb16);
  ExchCXX::XCKernel::vlapl_buffer_len((XCKernel *)in_stack_fffffffffffff090,(size_t)pIVar4);
  std::allocator<double>::allocator((allocator<double> *)0x17cb48);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0),
             (size_type)in_stack_fffffffffffff0a8,(allocator_type *)in_stack_fffffffffffff0a0);
  std::allocator<double>::~allocator((allocator<double> *)0x17cb74);
  ExchCXX::XCKernel::vtau_buffer_len((XCKernel *)in_stack_fffffffffffff090,(size_t)pIVar4);
  std::allocator<double>::allocator((allocator<double> *)0x17cba6);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0),
             (size_type)in_stack_fffffffffffff0a8,(allocator_type *)in_stack_fffffffffffff0a0);
  std::allocator<double>::~allocator((allocator<double> *)0x17cbd2);
  bVar1 = ExchCXX::XCKernel::is_lda((XCKernel *)0x17cbdf);
  if (bVar1) {
    if (local_4 == 0) {
      local_690 = std::vector<double,_std::allocator<double>_>::data
                            ((vector<double,_std::allocator<double>_> *)0x17cc03);
      local_698 = std::vector<double,_std::allocator<double>_>::data
                            ((vector<double,_std::allocator<double>_> *)0x17cc18);
      ExchCXX::XCKernel::eval_exc<int_const&,double*,double*>
                ((XCKernel *)in_stack_fffffffffffff0a0,
                 (int *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098),
                 (double **)in_stack_fffffffffffff090,(double **)pIVar4);
      local_6a0 = std::vector<double,_std::allocator<double>_>::data
                            ((vector<double,_std::allocator<double>_> *)0x17cc54);
      local_6a8 = std::vector<double,_std::allocator<double>_>::data
                            ((vector<double,_std::allocator<double>_> *)0x17cc69);
      ExchCXX::XCKernel::eval_exc<int_const&,double*,double*>
                ((XCKernel *)in_stack_fffffffffffff0a0,
                 (int *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098),
                 (double **)in_stack_fffffffffffff090,(double **)pIVar4);
    }
    else if (local_4 == 1) {
      local_6b0 = std::vector<double,_std::allocator<double>_>::data
                            ((vector<double,_std::allocator<double>_> *)0x17ce4d);
      local_6b8 = std::vector<double,_std::allocator<double>_>::data
                            ((vector<double,_std::allocator<double>_> *)0x17ce62);
      local_6c0 = std::vector<double,_std::allocator<double>_>::data
                            ((vector<double,_std::allocator<double>_> *)0x17ce77);
      ExchCXX::XCKernel::eval_exc_vxc<int_const&,double*,double*,double*>
                ((XCKernel *)in_stack_fffffffffffff0a0,
                 (int *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098),
                 (double **)in_stack_fffffffffffff090,(double **)pIVar4,(double **)0x17ceac);
      local_6c8 = std::vector<double,_std::allocator<double>_>::data
                            ((vector<double,_std::allocator<double>_> *)0x17cebb);
      local_6d0 = std::vector<double,_std::allocator<double>_>::data
                            ((vector<double,_std::allocator<double>_> *)0x17ced0);
      local_6d8 = std::vector<double,_std::allocator<double>_>::data
                            ((vector<double,_std::allocator<double>_> *)0x17cee5);
      ExchCXX::XCKernel::eval_exc_vxc<int_const&,double*,double*,double*>
                ((XCKernel *)in_stack_fffffffffffff0a0,
                 (int *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098),
                 (double **)in_stack_fffffffffffff090,(double **)pIVar4,(double **)0x17cf1a);
    }
    pcVar5 = (char *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098);
  }
  else {
    bVar1 = ExchCXX::XCKernel::is_gga((XCKernel *)0x17cf32);
    if (bVar1) {
      if (local_4 == 0) {
        local_6e0 = std::vector<double,_std::allocator<double>_>::data
                              ((vector<double,_std::allocator<double>_> *)0x17cf56);
        local_6e8 = std::vector<double,_std::allocator<double>_>::data
                              ((vector<double,_std::allocator<double>_> *)0x17cf6b);
        local_6f0 = std::vector<double,_std::allocator<double>_>::data
                              ((vector<double,_std::allocator<double>_> *)0x17cf80);
        ExchCXX::XCKernel::eval_exc<int_const&,double*,double*,double*>
                  ((XCKernel *)in_stack_fffffffffffff0a0,
                   (int *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098),
                   (double **)in_stack_fffffffffffff090,(double **)pIVar4,(double **)0x17cfb5);
        local_6f8 = std::vector<double,_std::allocator<double>_>::data
                              ((vector<double,_std::allocator<double>_> *)0x17cfc4);
        local_700 = std::vector<double,_std::allocator<double>_>::data
                              ((vector<double,_std::allocator<double>_> *)0x17cfd9);
        local_708 = std::vector<double,_std::allocator<double>_>::data
                              ((vector<double,_std::allocator<double>_> *)0x17cfee);
        ExchCXX::XCKernel::eval_exc<int_const&,double*,double*,double*>
                  ((XCKernel *)in_stack_fffffffffffff0a0,
                   (int *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098),
                   (double **)in_stack_fffffffffffff090,(double **)pIVar4,(double **)0x17d023);
      }
      else if (local_4 == 1) {
        local_710 = std::vector<double,_std::allocator<double>_>::data
                              ((vector<double,_std::allocator<double>_> *)0x17d045);
        local_718 = std::vector<double,_std::allocator<double>_>::data
                              ((vector<double,_std::allocator<double>_> *)0x17d05a);
        local_720 = std::vector<double,_std::allocator<double>_>::data
                              ((vector<double,_std::allocator<double>_> *)0x17d06f);
        local_728 = std::vector<double,_std::allocator<double>_>::data
                              ((vector<double,_std::allocator<double>_> *)0x17d084);
        local_730 = std::vector<double,_std::allocator<double>_>::data
                              ((vector<double,_std::allocator<double>_> *)0x17d099);
        ExchCXX::XCKernel::eval_exc_vxc<int_const&,double*,double*,double*,double*,double*>
                  ((XCKernel *)CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0),
                   (int *)in_stack_fffffffffffff0a8,(double **)in_stack_fffffffffffff0a0,
                   (double **)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098),
                   (double **)in_stack_fffffffffffff090,&local_730,
                   (double **)in_stack_fffffffffffff0c0);
        local_738 = std::vector<double,_std::allocator<double>_>::data
                              ((vector<double,_std::allocator<double>_> *)0x17d0f3);
        local_740 = std::vector<double,_std::allocator<double>_>::data
                              ((vector<double,_std::allocator<double>_> *)0x17d108);
        local_748 = std::vector<double,_std::allocator<double>_>::data
                              ((vector<double,_std::allocator<double>_> *)0x17d11d);
        local_758._8_8_ =
             std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x17d132);
        local_758._0_8_ =
             std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x17d147);
        pIVar4 = (ITransientExpression *)local_758;
        ExchCXX::XCKernel::eval_exc_vxc<int_const&,double*,double*,double*,double*,double*>
                  ((XCKernel *)CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0),
                   (int *)in_stack_fffffffffffff0a8,(double **)in_stack_fffffffffffff0a0,
                   (double **)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098),
                   (double **)in_stack_fffffffffffff090,(double **)pIVar4,
                   (double **)in_stack_fffffffffffff0c0);
      }
      pcVar5 = (char *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098);
    }
    else {
      bVar1 = ExchCXX::XCKernel::is_mgga((XCKernel *)0x17d1aa);
      pcVar5 = (char *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098);
      if (bVar1) {
        if (local_4 == 0) {
          local_760 = std::vector<double,_std::allocator<double>_>::data
                                ((vector<double,_std::allocator<double>_> *)0x17d1ce);
          local_768 = std::vector<double,_std::allocator<double>_>::data
                                ((vector<double,_std::allocator<double>_> *)0x17d1e3);
          local_770 = std::vector<double,_std::allocator<double>_>::data
                                ((vector<double,_std::allocator<double>_> *)0x17d1f8);
          local_778 = std::vector<double,_std::allocator<double>_>::data
                                ((vector<double,_std::allocator<double>_> *)0x17d20d);
          local_780 = std::vector<double,_std::allocator<double>_>::data
                                ((vector<double,_std::allocator<double>_> *)0x17d222);
          ExchCXX::XCKernel::eval_exc<int_const&,double*,double*,double*,double*,double*>
                    ((XCKernel *)CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0),
                     (int *)in_stack_fffffffffffff0a8,(double **)in_stack_fffffffffffff0a0,
                     (double **)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098),
                     (double **)in_stack_fffffffffffff090,&local_780,
                     (double **)in_stack_fffffffffffff0c0);
          local_788 = std::vector<double,_std::allocator<double>_>::data
                                ((vector<double,_std::allocator<double>_> *)0x17d27c);
          local_790 = std::vector<double,_std::allocator<double>_>::data
                                ((vector<double,_std::allocator<double>_> *)0x17d291);
          local_798 = std::vector<double,_std::allocator<double>_>::data
                                ((vector<double,_std::allocator<double>_> *)0x17d2a6);
          local_7a8._8_8_ =
               std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x17d2bb);
          local_7a8._0_8_ =
               std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x17d2d0);
          pIVar4 = (ITransientExpression *)local_7a8;
          ExchCXX::XCKernel::eval_exc<int_const&,double*,double*,double*,double*,double*>
                    ((XCKernel *)CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0),
                     (int *)in_stack_fffffffffffff0a8,(double **)in_stack_fffffffffffff0a0,
                     (double **)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098),
                     (double **)in_stack_fffffffffffff090,(double **)pIVar4,
                     (double **)in_stack_fffffffffffff0c0);
          pcVar5 = (char *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098);
        }
        else if (local_4 == 1) {
          local_7b0 = std::vector<double,_std::allocator<double>_>::data
                                ((vector<double,_std::allocator<double>_> *)0x17d33d);
          local_7b8 = std::vector<double,_std::allocator<double>_>::data
                                ((vector<double,_std::allocator<double>_> *)0x17d352);
          local_7c0 = std::vector<double,_std::allocator<double>_>::data
                                ((vector<double,_std::allocator<double>_> *)0x17d367);
          local_7c8 = std::vector<double,_std::allocator<double>_>::data
                                ((vector<double,_std::allocator<double>_> *)0x17d37c);
          local_7d0 = std::vector<double,_std::allocator<double>_>::data
                                ((vector<double,_std::allocator<double>_> *)0x17d391);
          local_7d8 = std::vector<double,_std::allocator<double>_>::data
                                ((vector<double,_std::allocator<double>_> *)0x17d3a6);
          local_7e0 = std::vector<double,_std::allocator<double>_>::data
                                ((vector<double,_std::allocator<double>_> *)0x17d3bb);
          local_7f0._8_8_ =
               std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x17d3d0);
          local_7f0._M_allocated_capacity =
               (size_type)
               std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x17d3e5);
          ExchCXX::XCKernel::
          eval_exc_vxc<int_const&,double*,double*,double*,double*,double*,double*,double*,double*,double*>
                    ((XCKernel *)in_stack_fffffffffffff0d0,(int *)in_stack_fffffffffffff0c8,
                     (double **)in_stack_fffffffffffff0c0,(double **)in_stack_fffffffffffff0b8.m_lhs
                     ,(double **)CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0),
                     (double **)&local_7f0._M_allocated_capacity,in_stack_fffffffffffff0f0,
                     in_stack_fffffffffffff0f8,in_stack_fffffffffffff100,in_stack_fffffffffffff108,
                     in_stack_fffffffffffff110);
          local_7f8 = std::vector<double,_std::allocator<double>_>::data
                                ((vector<double,_std::allocator<double>_> *)0x17d46f);
          local_820._32_8_ =
               std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x17d484);
          local_820._24_8_ =
               std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x17d499);
          local_820._16_8_ =
               std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x17d4ae);
          local_820._8_8_ =
               std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x17d4c3);
          local_820._0_8_ =
               std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x17d4d8);
          local_830._8_8_ =
               std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x17d4ed);
          local_830._0_8_ =
               std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x17d502);
          local_838 = std::vector<double,_std::allocator<double>_>::data
                                ((vector<double,_std::allocator<double>_> *)0x17d517);
          in_stack_fffffffffffff0a8 = &local_838;
          in_stack_fffffffffffff0a0 = (ScopedMessage *)local_830;
          pcVar5 = local_830 + 8;
          in_stack_fffffffffffff090 = (MessageBuilder *)local_820;
          pIVar4 = (ITransientExpression *)(local_820 + 8);
          ExchCXX::XCKernel::
          eval_exc_vxc<int_const&,double*,double*,double*,double*,double*,double*,double*,double*,double*>
                    ((XCKernel *)in_stack_fffffffffffff0d0,(int *)in_stack_fffffffffffff0c8,
                     (double **)in_stack_fffffffffffff0c0,(double **)in_stack_fffffffffffff0b8.m_lhs
                     ,(double **)CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0),
                     in_stack_fffffffffffff0a8,in_stack_fffffffffffff0f0,in_stack_fffffffffffff0f8,
                     in_stack_fffffffffffff100,in_stack_fffffffffffff108,in_stack_fffffffffffff110);
        }
      }
    }
  }
  for (local_840 = 0; uVar6 = local_840,
      sVar2 = ExchCXX::XCKernel::exc_buffer_len
                        ((XCKernel *)in_stack_fffffffffffff090,(size_t)pIVar4), uVar6 < sVar2;
      local_840 = local_840 + 1) {
    local_8f8 = operator____catch_sr((char *)in_stack_fffffffffffff090,(size_t)pIVar4);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_908,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]ExchCXX/test/xc_kernel_test.cxx"
               ,0x375);
    macroName_05.m_size = (size_type)in_stack_fffffffffffff0d0;
    macroName_05.m_start = (char *)in_stack_fffffffffffff0c8;
    Catch::MessageBuilder::MessageBuilder
              (in_stack_fffffffffffff0c0,macroName_05,
               (SourceLineInfo *)in_stack_fffffffffffff0b8.m_lhs,in_stack_fffffffffffff0b4);
    Catch::MessageBuilder::operator<<(in_stack_fffffffffffff090,(char (*) [22])pIVar4);
    Catch::MessageBuilder::operator<<(in_stack_fffffffffffff090,(Kernel *)pIVar4);
    Catch::ScopedMessage::ScopedMessage(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
    Catch::MessageBuilder::~MessageBuilder(in_stack_fffffffffffff090);
    local_960 = operator____catch_sr((char *)in_stack_fffffffffffff090,(size_t)pIVar4);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_970,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]ExchCXX/test/xc_kernel_test.cxx"
               ,0x376);
    local_980 = operator____catch_sr((char *)in_stack_fffffffffffff090,(size_t)pIVar4);
    pIVar4 = (ITransientExpression *)CONCAT44((int)((ulong)pIVar4 >> 0x20),2);
    macroName_02.m_size._0_4_ = in_stack_fffffffffffff0b0;
    macroName_02.m_start = (char *)in_stack_fffffffffffff0a8;
    macroName_02.m_size._4_4_ = in_stack_fffffffffffff0b4;
    capturedExpression_02.m_size = (size_type)in_stack_fffffffffffff0a0;
    capturedExpression_02.m_start = pcVar5;
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)in_stack_fffffffffffff090,macroName_02,(SourceLineInfo *)pIVar4,
               capturedExpression_02,(Flags)in_stack_fffffffffffff0c0);
    std::vector<double,_std::allocator<double>_>::operator[](local_600,local_840);
    local_9b8 = (double)Catch::operator<=<double,_0>((Decomposer *)pIVar4,7.71973619101781e-318);
    std::vector<double,_std::allocator<double>_>::operator[](local_560,local_840);
    Catch::Approx::Approx((Approx *)in_stack_fffffffffffff090,(double)pIVar4);
    Catch::operator==((ExprLhs<double> *)in_stack_fffffffffffff0b8.m_lhs,
                      (Approx *)CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0));
    Catch::AssertionHandler::handleExpr((AssertionHandler *)in_stack_fffffffffffff090,pIVar4);
    Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff090);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffff090);
    Catch::ScopedMessage::~ScopedMessage(in_stack_fffffffffffff0a0);
  }
  if (local_4 == 1) {
    local_9e8 = 0;
    while (uVar6 = local_9e8,
          sVar2 = ExchCXX::XCKernel::vrho_buffer_len
                            ((XCKernel *)in_stack_fffffffffffff090,(size_t)pIVar4), uVar6 < sVar2) {
      local_aa0 = operator____catch_sr((char *)in_stack_fffffffffffff090,(size_t)pIVar4);
      Catch::SourceLineInfo::SourceLineInfo
                (&local_ab0,
                 "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]ExchCXX/test/xc_kernel_test.cxx"
                 ,0x37b);
      macroName_06.m_size = (size_type)in_stack_fffffffffffff0d0;
      macroName_06.m_start = (char *)in_stack_fffffffffffff0c8;
      Catch::MessageBuilder::MessageBuilder
                (in_stack_fffffffffffff0c0,macroName_06,
                 (SourceLineInfo *)in_stack_fffffffffffff0b8.m_lhs,in_stack_fffffffffffff0b4);
      Catch::MessageBuilder::operator<<(in_stack_fffffffffffff090,(char (*) [23])pIVar4);
      Catch::MessageBuilder::operator<<(in_stack_fffffffffffff090,(Kernel *)pIVar4);
      Catch::ScopedMessage::ScopedMessage(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
      Catch::MessageBuilder::~MessageBuilder(in_stack_fffffffffffff090);
      local_b08 = operator____catch_sr((char *)in_stack_fffffffffffff090,(size_t)pIVar4);
      Catch::SourceLineInfo::SourceLineInfo
                (&local_b18,
                 "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]ExchCXX/test/xc_kernel_test.cxx"
                 ,0x37c);
      local_b28 = operator____catch_sr((char *)in_stack_fffffffffffff090,(size_t)pIVar4);
      pIVar4 = (ITransientExpression *)CONCAT44((int)((ulong)pIVar4 >> 0x20),2);
      macroName_03.m_size._0_4_ = in_stack_fffffffffffff0b0;
      macroName_03.m_start = (char *)in_stack_fffffffffffff0a8;
      macroName_03.m_size._4_4_ = in_stack_fffffffffffff0b4;
      capturedExpression_03.m_size = (size_type)in_stack_fffffffffffff0a0;
      capturedExpression_03.m_start = pcVar5;
      Catch::AssertionHandler::AssertionHandler
                ((AssertionHandler *)in_stack_fffffffffffff090,macroName_03,(SourceLineInfo *)pIVar4
                 ,capturedExpression_03,(Flags)in_stack_fffffffffffff0c0);
      std::vector<double,_std::allocator<double>_>::operator[](&local_620,local_9e8);
      local_b60 = (double)Catch::operator<=<double,_0>((Decomposer *)pIVar4,7.72402962148017e-318);
      std::vector<double,_std::allocator<double>_>::operator[](&local_580,local_9e8);
      Catch::Approx::Approx((Approx *)in_stack_fffffffffffff090,(double)pIVar4);
      Catch::operator==((ExprLhs<double> *)in_stack_fffffffffffff0b8.m_lhs,
                        (Approx *)CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0));
      Catch::AssertionHandler::handleExpr((AssertionHandler *)in_stack_fffffffffffff090,pIVar4);
      Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff090);
      Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffff090);
      Catch::ScopedMessage::~ScopedMessage(in_stack_fffffffffffff0a0);
      local_9e8 = local_9e8 + 1;
    }
    local_b90 = (ScopedMessage *)0x0;
    while (this = local_b90,
          pSVar3 = (ScopedMessage *)
                   ExchCXX::XCKernel::vsigma_buffer_len
                             ((XCKernel *)in_stack_fffffffffffff090,(size_t)pIVar4), this < pSVar3)
    {
      local_c58[0].m_info.macroName =
           operator____catch_sr((char *)in_stack_fffffffffffff090,(size_t)pIVar4);
      builder = local_c58;
      Catch::SourceLineInfo::SourceLineInfo
                ((SourceLineInfo *)builder,
                 "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]ExchCXX/test/xc_kernel_test.cxx"
                 ,0x37f);
      macroName_07.m_size = (size_type)in_stack_fffffffffffff0d0;
      macroName_07.m_start = (char *)in_stack_fffffffffffff0c8;
      Catch::MessageBuilder::MessageBuilder
                (in_stack_fffffffffffff0c0,macroName_07,
                 (SourceLineInfo *)in_stack_fffffffffffff0b8.m_lhs,in_stack_fffffffffffff0b4);
      in_stack_fffffffffffff0d0 =
           Catch::MessageBuilder::operator<<(in_stack_fffffffffffff090,(char (*) [25])pIVar4);
      in_stack_fffffffffffff0c8 =
           Catch::MessageBuilder::operator<<(in_stack_fffffffffffff090,(Kernel *)pIVar4);
      Catch::ScopedMessage::ScopedMessage(this,builder);
      Catch::MessageBuilder::~MessageBuilder(in_stack_fffffffffffff090);
      local_cc0.m_info.macroName =
           operator____catch_sr((char *)in_stack_fffffffffffff090,(size_t)pIVar4);
      in_stack_fffffffffffff0c0 = &local_cc0;
      Catch::SourceLineInfo::SourceLineInfo
                ((SourceLineInfo *)in_stack_fffffffffffff0c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]ExchCXX/test/xc_kernel_test.cxx"
                 ,0x380);
      operator____catch_sr((char *)in_stack_fffffffffffff090,(size_t)pIVar4);
      pIVar4 = (ITransientExpression *)CONCAT44((int)((ulong)pIVar4 >> 0x20),2);
      macroName_04.m_size._0_4_ = in_stack_fffffffffffff0b0;
      macroName_04.m_start = (char *)in_stack_fffffffffffff0a8;
      macroName_04.m_size._4_4_ = in_stack_fffffffffffff0b4;
      capturedExpression_04.m_size = (size_type)in_stack_fffffffffffff0a0;
      capturedExpression_04.m_start = pcVar5;
      Catch::AssertionHandler::AssertionHandler
                ((AssertionHandler *)in_stack_fffffffffffff090,macroName_04,(SourceLineInfo *)pIVar4
                 ,capturedExpression_04,(Flags)in_stack_fffffffffffff0c0);
      std::vector<double,_std::allocator<double>_>::operator[](&local_640,(size_type)local_b90);
      in_stack_fffffffffffff0b8 =
           Catch::operator<=<double,_0>((Decomposer *)pIVar4,7.72816495093586e-318);
      std::vector<double,_std::allocator<double>_>::operator[](&local_5a0,(size_type)local_b90);
      Catch::Approx::Approx((Approx *)in_stack_fffffffffffff090,(double)pIVar4);
      Catch::operator==((ExprLhs<double> *)in_stack_fffffffffffff0b8.m_lhs,
                        (Approx *)CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0));
      Catch::AssertionHandler::handleExpr((AssertionHandler *)in_stack_fffffffffffff090,pIVar4);
      Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff090);
      Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffff090);
      Catch::ScopedMessage::~ScopedMessage(in_stack_fffffffffffff0a0);
      local_b90 = (ScopedMessage *)((long)&(local_b90->m_info).macroName.m_start + 1);
    }
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0a0);
  ExchCXX::XCKernel::~XCKernel((XCKernel *)0x17e0d8);
  ExchCXX::XCKernel::~XCKernel((XCKernel *)0x17e0e5);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0a0);
  return;
}

Assistant:

void compare_libxc_builtin( TestInterface interface, EvalType evaltype,
  Kernel kern, Spin polar ) {

  size_t npts_lda, npts_gga, npts_mgga, npts_lapl;
  std::vector<double> ref_rho, ref_sigma, ref_lapl, ref_tau;
  std::tie(npts_lda, ref_rho  )  = load_reference_density( polar );
  std::tie(npts_gga, ref_sigma)  = load_reference_sigma  ( polar );
  std::tie(npts_lapl, ref_lapl)  = load_reference_lapl   ( polar );
  std::tie(npts_mgga, ref_tau)   = load_reference_tau    ( polar );

  REQUIRE( npts_lda == npts_gga );
  REQUIRE( npts_lda == npts_mgga );
  REQUIRE( npts_lda == npts_lapl );

  const int npts = npts_lda;

  XCKernel func_libxc  ( Backend::libxc,   kern, polar );
  XCKernel func_builtin( Backend::builtin, kern, polar );


  const int len_rho   = func_libxc.rho_buffer_len( npts );
  const int len_sigma = func_libxc.sigma_buffer_len( npts );
  const int len_lapl = func_libxc.lapl_buffer_len( npts );
  const int len_tau = func_libxc.tau_buffer_len( npts );

  std::vector<double> rho_small(len_rho, 1e-13);
  std::vector<double> sigma_small(len_sigma, 1e-14);
  std::vector<double> lapl_small(len_lapl, 1e-14);
  std::vector<double> tau_small(len_tau, 1e-14);

  std::vector<double> rho_zero(len_rho, 0.);
  std::vector<double> sigma_zero(len_sigma, 0.);
  std::vector<double> lapl_zero(len_lapl, 0.);
  std::vector<double> tau_zero(len_tau, 0.);

  std::vector<double> rho_use, sigma_use, lapl_use, tau_use;

  if( evaltype == EvalType::Regular ) {
    rho_use   = ref_rho;
    sigma_use = ref_sigma;
    lapl_use = ref_lapl;
    tau_use = ref_tau;
  }

  if( evaltype == EvalType::Small ) {
    rho_use   = rho_small;
    sigma_use = sigma_small;
    lapl_use = lapl_small;
    tau_use = tau_small;
  }

  if( evaltype == EvalType::Zero ) {
    rho_use   = rho_zero;
    sigma_use = sigma_zero;
    lapl_use = lapl_zero;
    tau_use = tau_zero;
  }



  std::vector<double> exc_libxc( func_builtin.exc_buffer_len(npts) );
  std::vector<double> vrho_libxc( func_builtin.vrho_buffer_len(npts) );
  std::vector<double> vsigma_libxc( func_builtin.vsigma_buffer_len(npts) );
  std::vector<double> vlapl_libxc( func_builtin.vlapl_buffer_len(npts) );
  std::vector<double> vtau_libxc( func_builtin.vtau_buffer_len(npts) );

  std::vector<double> exc_builtin( func_builtin.exc_buffer_len(npts) );
  std::vector<double> vrho_builtin( func_builtin.vrho_buffer_len(npts) );
  std::vector<double> vsigma_builtin( func_builtin.vsigma_buffer_len(npts) );
  std::vector<double> vlapl_builtin( func_builtin.vlapl_buffer_len(npts) );
  std::vector<double> vtau_builtin( func_builtin.vtau_buffer_len(npts) );

  if( func_libxc.is_lda() ) {

    if( interface == TestInterface::EXC ) {

      func_libxc.eval_exc( npts, rho_use.data(), exc_libxc.data() );
      func_builtin.eval_exc( npts, rho_use.data(), exc_builtin.data() );

    } else if( interface == TestInterface::EXC_VXC ) {

      func_libxc.eval_exc_vxc( npts, rho_use.data(), exc_libxc.data(),
        vrho_libxc.data() );
      func_builtin.eval_exc_vxc( npts, rho_use.data(), exc_builtin.data(),
        vrho_builtin.data() );

    }

  } else if( func_libxc.is_gga() ) {

    if( interface == TestInterface::EXC ) {

      func_libxc.eval_exc( npts, rho_use.data(), sigma_use.data(),
        exc_libxc.data() );
      func_builtin.eval_exc( npts, rho_use.data(), sigma_use.data(),
        exc_builtin.data() );

    } else if( interface == TestInterface::EXC_VXC ) {

      func_libxc.eval_exc_vxc( npts, rho_use.data(), sigma_use.data(),
        exc_libxc.data(), vrho_libxc.data(), vsigma_libxc.data() );
      func_builtin.eval_exc_vxc( npts, rho_use.data(), sigma_use.data(),
        exc_builtin.data(), vrho_builtin.data(), vsigma_builtin.data() );

    }

  } else if( func_libxc.is_mgga() ) {

    if( interface == TestInterface::EXC ) {

      func_libxc.eval_exc( npts, rho_use.data(), sigma_use.data(),
        lapl_use.data(), tau_use.data(), exc_libxc.data() );
      func_builtin.eval_exc( npts, rho_use.data(), sigma_use.data(),
        lapl_use.data(), tau_use.data(), exc_builtin.data() );

    } else if( interface == TestInterface::EXC_VXC ) {

      func_libxc.eval_exc_vxc( npts, rho_use.data(), sigma_use.data(),
        lapl_use.data(), tau_use.data(), exc_libxc.data(), vrho_libxc.data(), vsigma_libxc.data(), vlapl_libxc.data(), vtau_libxc.data() );
      func_builtin.eval_exc_vxc( npts, rho_use.data(), sigma_use.data(),
        lapl_use.data(), tau_use.data(), exc_builtin.data(), vrho_builtin.data(), vsigma_builtin.data(), vlapl_builtin.data(), vtau_builtin.data() );

    }

  }

  // Check correctness
  for( auto i = 0ul; i < func_libxc.exc_buffer_len(npts); ++i ) {
    INFO( "EXC Fails: Kernel is " << kern );
    CHECK( exc_builtin[i] == Approx(exc_libxc[i]) );
  }

  if( interface == TestInterface::EXC_VXC ) {
    for( auto i = 0ul; i < func_libxc.vrho_buffer_len(npts); ++i ) {
      INFO( "VRHO Fails: Kernel is " << kern );
      CHECK( vrho_builtin[i] == Approx(vrho_libxc[i]) );
    }
    for( auto i = 0ul; i < func_libxc.vsigma_buffer_len(npts); ++i ) {
      INFO( "VSIGMA Fails: Kernel is " << kern );
      CHECK( vsigma_builtin[i] == Approx(vsigma_libxc[i]) );
    }
  }

}